

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O2

void duckdb::ExtractPivotAggregates
               (BoundTableRef *node,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *aggregates)

{
  pointer puVar1;
  bool bVar2;
  BoundSubqueryRef *pBVar3;
  pointer pBVar4;
  BoundSelectNode *pBVar5;
  pointer pBVar6;
  pointer pEVar7;
  InternalException *pIVar8;
  pointer this;
  allocator local_51;
  string local_50;
  
  if (node->type != SUBQUERY) {
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_50,"Pivot - Expected a subquery",&local_51);
    InternalException::InternalException(pIVar8,&local_50);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar3 = BoundTableRef::Cast<duckdb::BoundSubqueryRef>(node);
  pBVar4 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->(&pBVar3->subquery);
  if (pBVar4->type != SELECT_NODE) {
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_50,"Pivot - Expected a select node",&local_51);
    InternalException::InternalException(pIVar8,&local_50);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar4 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->(&pBVar3->subquery);
  pBVar5 = BoundQueryNode::Cast<duckdb::BoundSelectNode>(pBVar4);
  pBVar6 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
           operator->(&pBVar5->from_table);
  if (pBVar6->type != SUBQUERY) {
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Pivot - Expected another subquery",&local_51);
    InternalException::InternalException(pIVar8,&local_50);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar6 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
           operator->(&pBVar5->from_table);
  pBVar3 = BoundTableRef::Cast<duckdb::BoundSubqueryRef>(pBVar6);
  pBVar4 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->(&pBVar3->subquery);
  if (pBVar4->type == SELECT_NODE) {
    pBVar4 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator->(&pBVar3->subquery);
    pBVar5 = BoundQueryNode::Cast<duckdb::BoundSelectNode>(pBVar4);
    puVar1 = (pBVar5->aggregates).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (pBVar5->aggregates).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this);
      bVar2 = ::std::operator==(&(pEVar7->super_BaseExpression).alias,"__collated_group");
      if (!bVar2) {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this);
        (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_50,pEVar7);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)aggregates,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_50);
        if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
      }
    }
    return;
  }
  pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Pivot - Expected another select node",&local_51);
  InternalException::InternalException(pIVar8,&local_50);
  __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ExtractPivotAggregates(BoundTableRef &node, vector<unique_ptr<Expression>> &aggregates) {
	if (node.type != TableReferenceType::SUBQUERY) {
		throw InternalException("Pivot - Expected a subquery");
	}
	auto &subq = node.Cast<BoundSubqueryRef>();
	if (subq.subquery->type != QueryNodeType::SELECT_NODE) {
		throw InternalException("Pivot - Expected a select node");
	}
	auto &select = subq.subquery->Cast<BoundSelectNode>();
	if (select.from_table->type != TableReferenceType::SUBQUERY) {
		throw InternalException("Pivot - Expected another subquery");
	}
	auto &subq2 = select.from_table->Cast<BoundSubqueryRef>();
	if (subq2.subquery->type != QueryNodeType::SELECT_NODE) {
		throw InternalException("Pivot - Expected another select node");
	}
	auto &select2 = subq2.subquery->Cast<BoundSelectNode>();
	for (auto &aggr : select2.aggregates) {
		if (aggr->GetAlias() == "__collated_group") {
			continue;
		}
		aggregates.push_back(aggr->Copy());
	}
}